

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scanner.cpp
# Opt level: O1

void __thiscall Scanner::scan(Scanner *this,string *filename)

{
  byte c;
  bool bVar1;
  int iVar2;
  int state;
  int iVar3;
  long lVar4;
  long lVar5;
  string buffer;
  string text;
  ifstream in;
  Automatic at;
  long *local_fe0;
  char *local_fd8;
  long local_fd0 [2];
  int local_fbc;
  long *local_fb8;
  long local_fb0;
  long local_fa8 [2];
  string local_f98;
  string local_f78;
  long local_f58 [4];
  byte abStack_f38 [200];
  undefined8 auStack_e70 [36];
  Automatic local_d50;
  
  local_fe0 = local_fd0;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_fe0,"");
  Automatic::Automatic(&local_d50);
  std::ifstream::ifstream(local_f58,(string *)filename,_S_in);
  if ((abStack_f38[*(long *)(local_f58[0] + -0x18)] & 5) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"open Error",10);
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
LAB_001174ba:
    exit(0);
  }
  local_fb8 = local_fa8;
  std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
            ((string *)&local_fb8,
             *(undefined8 *)((long)auStack_e70 + *(long *)(local_f58[0] + -0x18)),0xffffffff,0,
             0xffffffff);
  std::__cxx11::string::append((char *)&local_fb8);
  std::ifstream::close();
  bVar1 = false;
  iVar2 = 1;
LAB_001171f9:
  state = iVar2;
  iVar2 = this->curLine;
  iVar3 = this->curIndex;
  do {
    lVar5 = (long)iVar3;
    if (local_fb0 == lVar5) {
LAB_001173ff:
      if (local_fb8 != local_fa8) {
        operator_delete(local_fb8,local_fa8[0] + 1);
      }
      std::ifstream::~ifstream(local_f58);
      lVar5 = 0xcf0;
      do {
        std::
        _Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
        ::~_Rb_tree((_Rb_tree<char,_std::pair<const_char,_int>,_std::_Select1st<std::pair<const_char,_int>_>,_std::less<char>,_std::allocator<std::pair<const_char,_int>_>_>
                     *)(&local_d50.ac[0]._M_t._M_impl.field_0x0 + lVar5));
        lVar5 = lVar5 + -0x30;
      } while (lVar5 != -0x30);
      if (local_fe0 != local_fd0) {
        operator_delete(local_fe0,local_fd0[0] + 1);
      }
      return;
    }
    iVar3 = iVar3 + 2;
    lVar4 = lVar5 << 0x20;
    while( true ) {
      lVar4 = lVar4 + 0x100000000;
      this->curIndex = iVar3 + -1;
      c = *(byte *)((long)local_fb8 + lVar5);
      if ((!bVar1) || (c == 0x2a)) break;
      if (c == 10) {
        iVar2 = iVar2 + 1;
        this->curLine = iVar2;
      }
      lVar5 = lVar5 + 1;
      iVar3 = iVar3 + 1;
      if (local_fb0 == lVar5) goto LAB_001173ff;
    }
    if ((c != 0x2a) || (!bVar1)) break;
    this->curIndex = iVar3;
    bVar1 = false;
    if (*(char *)((long)local_fb8 + (lVar4 >> 0x20)) != '/') {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,"comment is error",0x10);
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
      goto LAB_001174ba;
    }
  } while( true );
  if (c < 0xd) {
    if (c != 9) {
      if (c != 10) goto LAB_00117322;
      this->curLine = this->curLine + 1;
    }
  }
  else if ((c != 0xd) && (c != 0x20)) {
LAB_00117322:
    local_fbc = (int)(char)c;
    iVar2 = Automatic::getState(&local_d50,state,c);
    if (state != 1 || iVar2 != 1) {
      if (iVar2 == 0) {
        if (state == 0x2b) {
          bVar1 = true;
          std::__cxx11::string::_M_replace((ulong)&local_fe0,0,local_fd8,0x12c815);
        }
        else {
          local_f98._M_dataplus._M_p = (pointer)&local_f98.field_2;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_f98,local_fe0,local_fd8 + (long)local_fe0);
          tokenGenerate(this,state,&local_f98);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f98._M_dataplus._M_p != &local_f98.field_2) {
            operator_delete(local_f98._M_dataplus._M_p,local_f98.field_2._M_allocated_capacity + 1);
          }
          std::__cxx11::string::_M_replace((ulong)&local_fe0,0,local_fd8,0x12c815);
        }
        this->curIndex = this->curIndex + -1;
        iVar2 = 1;
      }
      else {
        std::__cxx11::string::push_back((char)&local_fe0);
      }
    }
    goto LAB_001171f9;
  }
  local_f78._M_dataplus._M_p = (pointer)&local_f78.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_f78,local_fe0,local_fd8 + (long)local_fe0);
  tokenGenerate(this,state,&local_f78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f78._M_dataplus._M_p != &local_f78.field_2) {
    operator_delete(local_f78._M_dataplus._M_p,local_f78.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::_M_replace((ulong)&local_fe0,0,local_fd8,0x12c815);
  iVar2 = 1;
  goto LAB_001171f9;
}

Assistant:

void Scanner::scan(string filename) {
    bool comment = false; //是否有注释
    int state = 1;   //当前状态
    int stateBefore = 1; //前一个状态
    char curChar; //当前字符
    int pos = 0;  //当前位置
    string buffer = ""; //识别到的串
    Automatic at; //初始化自动机
    //int comment_cnt = 0;
    //暂时取消
    ifstream in(filename, ios::in);
    if (!in) {
        cout << "open Error" << endl;
        exit(0);
    }

    //读取文件内容
    istreambuf_iterator<char> begin(in), end;
    string text(begin, end);
    text += "\n";
    in.close();

    //cout << text << endl;

    while (curIndex != text.size()) {
        curChar = text[curIndex++];
        if (comment && curChar != '*') {
            if(curChar == '\n') curLine++;
            continue;
        } else if (curChar == '*' && comment) {
            curChar = text[curIndex++];
            if (curChar == '/') {
                comment = false;
                continue;
            } else {
                cout << "comment is error" << endl;
                exit(0);
            }
        }
        //跳过空格 换行符 \t 以及回车
        if (curChar == '\n' || curChar == '\t' || curChar == ' ' || curChar == '\r') {
            if (curChar == '\n') curLine++;
            tokenGenerate(state, buffer);
            buffer = "";
            state = 1;
            continue;
        }

        stateBefore = state;
        state = at.getState(state, curChar);
        //自动机扫描
        if (state == 1 && stateBefore == 1) {}
        else if (state) {
            buffer += curChar;
        } else {
            //判断是否为注释
            if (stateBefore == 43) {
                comment = true;
                //cout << buffer << endl;
                reset(state, pos, buffer);
                continue;
            }


            tokenGenerate(stateBefore, buffer);
            reset(state, pos, buffer);
        }
    }
}